

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ushort *puVar1;
  ushort uVar2;
  uint i;
  int iVar3;
  ffe_t *pfVar4;
  ffe_t fVar5;
  uint i_1;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint i_2;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 local_58 [32];
  ulong uVar9;
  
  uVar7 = 1;
  iVar3 = 0;
  do {
    uVar10 = uVar7 * 2;
    GFExp[uVar7] = (ffe_t)iVar3;
    uVar7 = uVar10;
    if (0xffff < uVar10) {
      uVar7 = uVar10 ^ 0x1002d;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0xffff);
  pfVar4 = GFLog;
  uVar6 = 0;
  GFExp[0] = 0xffff;
  GFLog[0] = 0;
  do {
    uVar2 = kGFBasis[uVar6];
    uVar12 = 1L << (uVar6 & 0x3f);
    uVar13 = uVar12 & 0xffffffff;
    if ((uint)uVar12 < 2) {
      uVar13 = 1;
    }
    lVar14 = (uVar12 & 0xffffffff) * 2;
    lVar8 = 0;
    do {
      puVar1 = (ushort *)((long)GFLog + lVar8);
      lVar11 = lVar14 + lVar8;
      lVar8 = lVar8 + 2;
      *(ushort *)((long)GFLog + lVar11) = *puVar1 ^ uVar2;
    } while (uVar13 * 2 != lVar8);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10);
  lVar8 = 0;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar8 + 0x60));
    auVar20 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar8 + 0x40));
    auVar21 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar8 + 0x20));
    auVar22 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)GFLog + lVar8));
    auVar18 = vpinsrw_avx(ZEXT216(GFExp[auVar19._0_4_]),(uint)GFExp[auVar19._8_4_],1);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar19._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar19,2);
    auVar16 = vextracti32x4_avx512f(auVar19,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar19._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar15._0_4_],4);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar15._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar16._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFExp[auVar20._0_4_]),(uint)GFExp[auVar20._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar20._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar20,2);
    auVar17 = vextracti32x4_avx512f(auVar20,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar20._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._0_4_],4);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._0_4_],6);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._8_4_],7);
    auVar16 = vpinsrw_avx(ZEXT216(GFExp[auVar21._0_4_]),(uint)GFExp[auVar21._8_4_],1);
    auVar23._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar15;
    auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    auVar18 = vpinsrw_avx(auVar16,(uint)GFExp[auVar21._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar21,2);
    auVar16 = vextracti32x4_avx512f(auVar21,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar21._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar15._0_4_],4);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar15._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar16._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFExp[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFExp[auVar22._0_4_]),(uint)GFExp[auVar22._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar22._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar22,2);
    auVar17 = vextracti32x4_avx512f(auVar22,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar22._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._0_4_],4);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._0_4_],6);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFExp[auVar17._8_4_],7);
    auVar19 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                             ZEXT116(1) * auVar18,
                                             ZEXT116(0) * auVar18 + ZEXT116(1) * auVar15)),auVar23,1
                        );
    auVar19 = vmovdqu64_avx512f(auVar19);
    *(undefined1 (*) [64])((long)GFLog + lVar8) = auVar19;
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x20000);
  lVar8 = -0x10000;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])pfVar4);
    pfVar4 = (ffe_t *)((long)pfVar4 + 0x10);
    fVar5 = (ffe_t)lVar8;
    GFExp[auVar19._0_4_] = fVar5;
    auVar18 = vextracti32x4_avx512f(auVar19,2);
    auVar15 = vextracti32x4_avx512f(auVar19,3);
    GFExp[auVar19._8_4_] = fVar5 + 1;
    lVar14 = CONCAT44((int)((ulong)lVar14 >> 0x20),auVar18._0_4_);
    lVar11 = CONCAT44((int)((ulong)lVar11 >> 0x20),auVar15._0_4_);
    uVar6 = (ulong)auVar15._8_4_;
    GFExp[auVar19._16_4_] = fVar5 + 2;
    GFExp[auVar19._24_4_] = fVar5 + 3;
    GFExp[lVar14] = fVar5 + 4;
    GFExp[auVar18._8_4_] = fVar5 + 5;
    GFExp[lVar11] = fVar5 + 6;
    lVar8 = lVar8 + 8;
    GFExp[uVar6] = fVar5 + 7;
  } while (lVar8 != 0);
  GFExp[0xffff] = GFExp[0];
  lVar14 = 1;
  uVar12 = 0;
  local_58 = vmovdqu16_avx512vl(_DAT_001032c0);
  do {
    uVar7 = ~(-1 << ((uint)uVar12 & 0x1f));
    uVar9 = (ulong)uVar7;
    skewVec[uVar9] = 0;
    uVar13 = uVar12;
    do {
      uVar10 = 2 << ((uint)uVar13 & 0x1f);
      if (uVar7 < uVar10) {
        uVar2 = *(ushort *)(local_58 + uVar13 * 2);
        lVar8 = 0;
        do {
          lVar11 = lVar8 + (ulong)(uint)(2 << ((uint)uVar12 & 0x1f));
          skewVec[lVar8 + uVar9 + uVar10] = skewVec[lVar8 + uVar9] ^ uVar2;
          uVar6 = uVar9 + lVar11;
          lVar8 = lVar11;
        } while (uVar6 < uVar10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0xf);
    uVar2 = *(ushort *)(local_58 + uVar12 * 2);
    if ((ulong)uVar2 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)GFExp[((uint)GFLog[uVar2] + (uint)GFLog[uVar2 ^ 1] >> 0x10) +
                            (uint)GFLog[uVar2] + (uint)GFLog[uVar2 ^ 1] & 0xffff];
    }
    *(ffe_t *)(local_58 + uVar12 * 2) = ~GFLog[uVar13];
    lVar8 = lVar14;
    if (uVar12 < 0xe) {
      do {
        uVar2 = *(ushort *)(local_58 + lVar8 * 2);
        if ((ulong)uVar2 == 0) {
          fVar5 = 0;
        }
        else {
          uVar7 = (((uint)GFLog[uVar2 ^ 1] + (uint)*(ushort *)(local_58 + uVar12 * 2) >> 0x10) +
                   (uint)GFLog[uVar2 ^ 1] + (uint)*(ushort *)(local_58 + uVar12 * 2) & 0xffff) +
                  (uint)GFLog[uVar2];
          uVar6 = (ulong)((uVar7 >> 0x10) + uVar7 & 0xffff);
          fVar5 = GFExp[uVar6];
        }
        *(ffe_t *)(local_58 + lVar8 * 2) = fVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0xf);
    }
    uVar12 = uVar12 + 1;
    lVar14 = lVar14 + 1;
  } while (uVar12 != 0xf);
  lVar14 = 0;
  do {
    auVar19 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar14 + 0x60));
    auVar20 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar14 + 0x40));
    auVar21 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar14 + 0x20));
    auVar22 = vpmovzxwq_avx512f(*(undefined1 (*) [16])((long)skewVec + lVar14));
    auVar18 = vpinsrw_avx(ZEXT216(GFLog[CONCAT44((int)(uVar6 >> 0x20),auVar19._0_4_)]),
                          (uint)GFLog[auVar19._8_4_],1);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar19._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar19,2);
    auVar16 = vextracti32x4_avx512f(auVar19,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar19._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar15._0_4_],4);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar15._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar16._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFLog[auVar20._0_4_]),(uint)GFLog[auVar20._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar20._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar20,2);
    auVar17 = vextracti32x4_avx512f(auVar20,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar20._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._0_4_],4);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar17._0_4_],6);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar17._8_4_],7);
    auVar16 = vpinsrw_avx(ZEXT216(GFLog[auVar21._0_4_]),(uint)GFLog[auVar21._8_4_],1);
    auVar24._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar15;
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
    auVar18 = vpinsrw_avx(auVar16,(uint)GFLog[auVar21._16_4_],2);
    auVar15 = vextracti32x4_avx512f(auVar21,2);
    auVar16 = vextracti32x4_avx512f(auVar21,3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar21._24_4_],3);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar15._0_4_],4);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar15._8_4_],5);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar16._0_4_],6);
    auVar18 = vpinsrw_avx(auVar18,(uint)GFLog[auVar16._8_4_],7);
    auVar15 = vpinsrw_avx(ZEXT216(GFLog[auVar22._0_4_]),(uint)GFLog[auVar22._8_4_],1);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar22._16_4_],2);
    auVar16 = vextracti32x4_avx512f(auVar22,2);
    auVar17 = vextracti32x4_avx512f(auVar22,3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar22._24_4_],3);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._0_4_],4);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar16._8_4_],5);
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[auVar17._0_4_],6);
    uVar6 = (ulong)auVar17._8_4_;
    auVar15 = vpinsrw_avx(auVar15,(uint)GFLog[uVar6],7);
    auVar19 = vinserti64x4_avx512f
                        (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                             ZEXT116(1) * auVar18,
                                             ZEXT116(0) * auVar18 + ZEXT116(1) * auVar15)),auVar24,1
                        );
    auVar19 = vmovdqu64_avx512f(auVar19);
    *(undefined1 (*) [64])((long)skewVec + lVar14) = auVar19;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0x20000);
  uVar7 = 0x125090;
  memcpy(log_walsh,GFLog,0x20000);
  log_walsh[0] = 0;
  FWHT(log_walsh,uVar7);
  uVar6 = time((time_t *)0x0);
  do {
    test(0x8000,0x8000,(uint)uVar6);
    uVar6 = (ulong)((uint)uVar6 + 1);
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Fill GFLog table and GFExp table
    InitField();

    // Compute factors used in erasure decoder
    InitFieldOperations();

    unsigned seed = (unsigned)time(NULL);
    for (;;)
    {
#ifdef LEO_SHORT_FIELD
        const unsigned input_count = 32;
        const unsigned recovery_count = 16;
#else // LEO_SHORT_FIELD
        const unsigned input_count = 32768;
        const unsigned recovery_count = 32768;
#endif // LEO_SHORT_FIELD

        test(input_count, recovery_count, seed);

        ++seed;
    }

    return 0;
}